

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int av1_get_max_num_workers(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    iVar1 = (cpi->ppi->p_mt_info).num_mod_workers[lVar3];
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
  }
  iVar1 = (cpi->oxcf).max_threads;
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int av1_get_max_num_workers(const AV1_COMP *cpi) {
  int max_num_workers = 0;
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++)
    max_num_workers =
        AOMMAX(cpi->ppi->p_mt_info.num_mod_workers[i], max_num_workers);
  assert(max_num_workers >= 1);
  return AOMMIN(max_num_workers, cpi->oxcf.max_threads);
}